

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Library::PropertyNameExists(Library *this,String *name)

{
  bool bVar1;
  _Self local_40 [3];
  _Self local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  String *name_local;
  Library *this_local;
  
  lock._M_device = (mutex_type *)name;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_propertyMutex);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
       ::find(&this->m_propertyNameTable,(key_type *)lock._M_device);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
       ::end(&this->m_propertyNameTable);
  bVar1 = std::operator==(&local_28,local_40);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return (bool)(bVar1 - 1U & 1);
}

Assistant:

inline_t bool Library::PropertyNameExists(const String & name) const
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		return m_propertyNameTable.find(name) == m_propertyNameTable.end() ? false : true;
	}